

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu_snapshot.cpp
# Opt level: O2

void __thiscall Nes_Apu::save_snapshot(Nes_Apu *this,apu_snapshot_t *state)

{
  int i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 != 0x14; uVar1 = uVar1 + 1) {
    state->w40xx[uVar1] = this->oscs[uVar1 >> 2 & 0x3fffffff]->regs[(uint)uVar1 & 3];
  }
  state->w40xx[0x11] = (byte)(this->dmc).dac;
  state->w4015 = (byte)this->osc_enables;
  state->w4017 = (byte)this->frame_mode;
  state->delay = (uint16_t)this->frame_delay;
  state->step = (byte)this->frame;
  state->irq_flag = this->irq_flag;
  apu_reflection<1>::reflect_square(&state->square1,&this->square1);
  apu_reflection<1>::reflect_square(&state->square2,&this->square2);
  (state->triangle).delay = (uint16_t)(this->triangle).super_Nes_Osc.delay;
  (state->triangle).length = (byte)(this->triangle).super_Nes_Osc.length_counter;
  (state->triangle).linear_counter = (byte)(this->triangle).linear_counter;
  (state->triangle).linear_mode = (this->triangle).super_Nes_Osc.reg_written[3];
  apu_reflection<1>::reflect_noise(&state->noise,&this->noise);
  apu_reflection<1>::reflect_dmc(&state->dmc,&this->dmc);
  return;
}

Assistant:

void Nes_Apu::save_snapshot( apu_snapshot_t* state ) const
{
	for ( int i = 0; i < osc_count * 4; i++ )
		state->w40xx [i] = oscs [i >> 2]->regs [i & 3];
	state->w40xx [0x11] = dmc.dac;
	
	state->w4015    = osc_enables;
	state->w4017    = frame_mode;
	state->delay    = frame_delay;
	state->step     = frame;
	state->irq_flag = irq_flag;
	
	typedef apu_reflection<1> refl;
	Nes_Apu& apu = *(Nes_Apu*) this; // const_cast
	refl::reflect_square  ( state->square1,     apu.square1 );
	refl::reflect_square  ( state->square2,     apu.square2 );
	refl::reflect_triangle( state->triangle,    apu.triangle );
	refl::reflect_noise   ( state->noise,       apu.noise );
	refl::reflect_dmc     ( state->dmc,         apu.dmc );
}